

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForAllHelp::~CallForAllHelp(CallForAllHelp *this)

{
  CallForAllHelp *this_local;
  
  ~CallForAllHelp(this);
  operator_delete(this);
  return;
}

Assistant:

CallForAllHelp()
        : CallForAllHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}